

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void frstage(float *ioptr,long M,float *Utbl)

{
  float *pfVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  lVar12 = 1;
  uVar13 = 1L << ((ulong)((int)M - 1) & 0x3f);
  pfVar1 = ioptr + (uVar13 >> 1);
  lVar17 = 1L << ((ulong)((int)M - 3) & 0x3f);
  fVar3 = *ioptr + *ioptr;
  fVar4 = ioptr[1] + ioptr[1];
  fVar5 = pfVar1[uVar13] + *pfVar1;
  fVar9 = pfVar1[1] - pfVar1[uVar13 + 1];
  fVar7 = (pfVar1[uVar13 + 1] + pfVar1[1]) * Utbl[lVar17];
  fVar8 = (pfVar1[uVar13] - *pfVar1) * Utbl[lVar17];
  fVar6 = fVar8 + fVar5 + fVar7;
  auVar23 = vfmsub132ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),ZEXT416(0x40000000));
  fVar8 = (fVar9 - fVar7) + fVar8;
  uVar2 = *(undefined8 *)(ioptr + uVar13);
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar8),ZEXT416(0xc0000000));
  *ioptr = fVar4 + fVar3;
  ioptr[1] = fVar3 - fVar4;
  auVar21._0_4_ = (float)uVar2 * 2.0;
  auVar21._4_4_ = (float)((ulong)uVar2 >> 0x20) * -2.0;
  auVar21._8_8_ = 0;
  uVar2 = vmovlps_avx(auVar21);
  *(undefined8 *)(ioptr + uVar13) = uVar2;
  *pfVar1 = fVar6;
  pfVar1[1] = fVar8;
  pfVar1[uVar13] = auVar23._0_4_;
  pfVar1[uVar13 + 1] = auVar10._0_4_;
  uVar15 = -1L << ((ulong)(byte)((char)M - 2) & 0x3f);
  fVar3 = Utbl[1];
  fVar4 = Utbl[~uVar15];
  lVar16 = ~(uVar15 * 2) + uVar13;
  lVar18 = uVar15 * -4;
  lVar14 = uVar13 + 3;
  while (lVar17 != lVar12) {
    fVar5 = *(float *)((long)ioptr + lVar18 * 2 + -8);
    fVar6 = *(float *)((long)ioptr + lVar18 * 2 + -4);
    fVar8 = ioptr[lVar14 + -1];
    auVar21 = ZEXT416((uint)(ioptr[lVar16 + -1] - ioptr[lVar12 * 2]));
    auVar22 = ZEXT416((uint)(ioptr[lVar16 + -1] + ioptr[lVar12 * 2]));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar21,auVar22);
    auVar20 = ZEXT416((uint)fVar3);
    auVar23 = ZEXT416((uint)(ioptr[lVar16] + ioptr[lVar12 * 2 + 1]));
    auVar10 = vfmadd231ss_fma(auVar10,auVar23,auVar20);
    auVar27 = ZEXT416((uint)(ioptr[lVar12 * 2 + 1] - ioptr[lVar16]));
    auVar23 = vfmsub213ss_fma(auVar23,ZEXT416((uint)fVar4),auVar27);
    auVar11 = vfmsub231ss_fma(auVar23,auVar20,auVar21);
    auVar19 = SUB6416(ZEXT464(0x40000000),0);
    auVar23 = vfmsub213ss_fma(auVar22,auVar19,auVar10);
    auVar24 = ZEXT416((uint)(fVar6 - ioptr[lVar14]));
    auVar26 = ZEXT416((uint)(ioptr[lVar14] + fVar6));
    auVar21 = vfmsub213ss_fma(auVar20,auVar26,auVar24);
    ioptr[lVar12 * 2] = auVar10._0_4_;
    auVar22 = ZEXT416((uint)(fVar8 + fVar5));
    auVar25 = ZEXT416((uint)(fVar8 - fVar5));
    auVar10 = vfmadd213ss_fma(auVar20,auVar25,auVar22);
    auVar20 = vfnmadd213ss_fma(auVar27,auVar19,auVar11);
    ioptr[lVar12 * 2 + 1] = auVar11._0_4_;
    ioptr[lVar16 + -1] = auVar23._0_4_;
    auVar21 = vfmsub231ss_fma(auVar21,auVar25,ZEXT416((uint)fVar4));
    auVar10 = vfmadd231ss_fma(auVar10,auVar26,ZEXT416((uint)fVar4));
    ioptr[lVar16] = auVar20._0_4_;
    auVar11 = vfnmadd213ss_fma(auVar24,auVar19,auVar21);
    lVar16 = lVar16 + -2;
    fVar3 = Utbl[lVar12 + 1];
    fVar4 = *(float *)((long)Utbl + lVar18 + -8);
    lVar12 = lVar12 + 1;
    auVar23 = vfmsub213ss_fma(auVar22,auVar19,auVar10);
    *(int *)((long)ioptr + lVar18 * 2 + -8) = auVar10._0_4_;
    *(int *)((long)ioptr + lVar18 * 2 + -4) = auVar21._0_4_;
    lVar18 = lVar18 + -4;
    ioptr[lVar14 + -1] = auVar23._0_4_;
    ioptr[lVar14] = auVar11._0_4_;
    lVar14 = lVar14 + 2;
  }
  return;
}

Assistant:

static inline void frstage(float *ioptr, long M, float *Utbl){
/*	Finish RFFT		*/

unsigned long 	pos;
unsigned long 	posi;
unsigned long 	diffUcnt;

float 	*p0r, *p1r;
float 	*u0r, *u0i;

float w0r, w0i;
float f0r, f0i, f1r, f1i, f4r, f4i, f5r, f5i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pos = POW2(M-1);
posi = pos + 1;

p0r = ioptr;
p1r = ioptr + pos/2;

u0r = Utbl + POW2(M-3);

w0r =  *u0r,

f0r = *(p0r);
f0i = *(p0r + 1);
f4r = *(p0r + pos);
f4i = *(p0r + posi);
f1r = *(p1r);
f1i = *(p1r + 1);
f5r = *(p1r + pos);
f5i = *(p1r + posi);

	t0r = Two * f0r + Two * f0i;    /* compute Re(x[0]) */
	t0i = Two * f0r - Two * f0i;    /* compute Re(x[N/2]) */
	t1r = f4r + f4r;
	t1i = -f4i - f4i;

	f0r = f1r + f5r;
	f0i = f1i - f5i;
	f4r = f1i + f5i;
	f4i = f5r - f1r;

	f1r = f0r + w0r * f4r + w0r * f4i;
	f1i = f0i - w0r * f4r + w0r * f4i;
	f5r = Two * f0r - f1r;
	f5i = f1i - Two * f0i;

*(p0r) = t0r;
*(p0r + 1) = t0i;
*(p0r + pos) = t1r;
*(p0r + posi) = t1i;
*(p1r) = f1r;
*(p1r + 1) = f1i;
*(p1r + pos) = f5r;
*(p1r + posi) = f5i;

u0r = Utbl + 1;
u0i = Utbl + (POW2(M-2)-1);

w0r =  *u0r,
w0i =  *u0i;
	
p0r = (ioptr + 2);
p1r = (ioptr + (POW2(M-2)-1)*2);

				/* Butterflys */
				/*
		f0	-	t0	-	-	f0
		f5	-	t1	- w0	-	f5

		f1	-	t0	-	-	f1
		f4	-	t1	-iw0 -	f4
				*/

for (diffUcnt = POW2(M-3)-1; diffUcnt > 0 ; diffUcnt--){

	f0r = *(p0r);
	f0i = *(p0r + 1);
	f5r = *(p1r + pos);
	f5i = *(p1r + posi);
	f1r = *(p1r);
	f1i = *(p1r + 1);
	f4r = *(p0r + pos);
	f4i = *(p0r + posi);

	t0r = f0r + f5r;
	t0i = f0i - f5i;
	t1r = f0i + f5i;
	t1i = f5r - f0r;

	f0r = t0r + w0r * t1r + w0i * t1i;
	f0i = t0i - w0i * t1r + w0r * t1i;
	f5r = Two * t0r - f0r;
	f5i = f0i - Two * t0i;

	t0r = f1r + f4r;
	t0i = f1i - f4i;
	t1r = f1i + f4i;
	t1i = f4r - f1r;

	f1r = t0r + w0i * t1r + w0r * t1i;
	f1i = t0i - w0r * t1r + w0i * t1i;
	f4r = Two * t0r - f1r;
	f4i = f1i - Two * t0i;

	*(p0r) = f0r;
	*(p0r + 1) = f0i;
	*(p1r + pos) = f5r;
	*(p1r + posi) = f5i;

	w0r = *++u0r;
	w0i = *--u0i;

	*(p1r) = f1r;
	*(p1r + 1) = f1i;
	*(p0r + pos) = f4r;
	*(p0r + posi) = f4i;

	p0r += 2;
	p1r -= 2;
};
}